

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::DisposeAllPolyPts(Clipper *this)

{
  pointer ppOVar1;
  pointer ppOVar2;
  size_type index;
  
  ppOVar1 = (this->m_PolyOuts).
            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppOVar2 = (this->m_PolyOuts).
            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppOVar2 != ppOVar1) {
    index = 0;
    do {
      DisposeOutRec(this,index);
      index = index + 1;
      ppOVar1 = (this->m_PolyOuts).
                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppOVar2 = (this->m_PolyOuts).
                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (index < (ulong)((long)ppOVar2 - (long)ppOVar1 >> 3));
  }
  if (ppOVar2 != ppOVar1) {
    (this->m_PolyOuts).
    super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppOVar1;
  }
  return;
}

Assistant:

void Clipper::DisposeAllPolyPts(){
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
    DisposeOutRec(i);
  m_PolyOuts.clear();
}